

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.c
# Opt level: O1

void cdns_drop_request(dns_request *req)

{
  uint *puVar1;
  undefined4 uVar2;
  
  _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cdns.c",0x14d,
             "cdns_drop_request",0,7,"dropping request %x @ state: %d",(ulong)req->id,
             (ulong)(uint)(int)req->state);
  if (req->server != (server_info *)0x0) {
    puVar1 = &(req->server->stats).n_drop;
    *puVar1 = *puVar1 + 1;
  }
  if (req->resolver != (event *)0x0) {
    uVar2 = event_get_fd();
    event_free(req->resolver);
    evutil_closesocket(uVar2);
  }
  free(req);
  return;
}

Assistant:

static void cdns_drop_request(dns_request * req)
{
    int fd;
    log_error(LOG_DEBUG, "dropping request %x @ state: %d", req->id, req->state);

    if (req->server)
        req->server->stats.n_drop += 1;
    if (req->resolver) {
        fd = event_get_fd(req->resolver);
        event_free(req->resolver);
        evutil_closesocket(fd);
    }
    free(req);
}